

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1>
::
Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1>,_google::protobuf::Map<long,_double>_>
::UseKeyAndValueFromEntry
          (Parser<google::protobuf::internal::MapFieldLite<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1>,_google::protobuf::Map<long,_double>_>
           *this)

{
  uint32_t *puVar1;
  MapEntryImpl<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1>
  *pMVar2;
  int iVar3;
  undefined4 extraout_var;
  pair<google::protobuf::Map<long,_double>::InnerMap::iterator_base<google::protobuf::MapPair<long,_double>_>,_bool>
  local_30;
  
  iVar3 = (*(this->entry_->super_MessageLite)._vptr_MessageLite[0xd])();
  this->key_ = *(long *)CONCAT44(extraout_var,iVar3);
  Map<long,double>::InnerMap::insert<long_const&>(&local_30,this->map_,&this->key_);
  this->value_ptr_ = (double *)&(local_30.first.node_)->field_0x8;
  pMVar2 = this->entry_;
  puVar1 = pMVar2->_has_bits_;
  *puVar1 = *puVar1 | 2;
  *(ValueOnMemory *)&(local_30.first.node_)->field_0x8 = pMVar2->value_;
  return;
}

Assistant:

void UseKeyAndValueFromEntry() {
      // Update key_ in case we need it later (because key() is called).
      // This is potentially inefficient, especially if the key is
      // expensive to copy (e.g., a long string), but this is a cold
      // path, so it's not a big deal.
      key_ = entry_->key();
      value_ptr_ = &(*map_)[key_];
      ValueMover::Move(entry_->mutable_value(), value_ptr_);
    }